

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O1

Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
GuiScope::writeExport
          (Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GuiScope *this,string_view config,UniformsMap *uniforms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer local_58;
  pointer local_50;
  undefined1 local_48 [40];
  _Alloc_hider _Stack_20;
  
  local_58 = (pointer)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Not implemented","",config._M_str);
  if (local_58 == (pointer)local_48) {
    _Stack_20._M_p = (pointer)local_48._8_8_;
    local_48._16_8_ = (pointer)(local_48 + 0x20);
  }
  else {
    local_48._16_8_ = local_58;
  }
  local_48._33_7_ = local_48._1_7_;
  local_48[0x20] = local_48[0];
  paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
  (__return_storage_ptr__->field_0).value_.sections.
  super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)paVar1;
  if ((pointer)local_48._16_8_ == (pointer)(local_48 + 0x20)) {
    paVar1->_M_allocated_capacity = local_48._32_8_;
    *(pointer *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
         _Stack_20._M_p;
  }
  else {
    (__return_storage_ptr__->field_0).value_.sections.
    super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_48._16_8_;
    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_48._32_8_;
  }
  (__return_storage_ptr__->field_0).value_.sections.
  super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data._M_finish =
       local_50;
  __return_storage_ptr__->has_value_ = false;
  return __return_storage_ptr__;
}

Assistant:

Expected<IAutomation::ExportResult, std::string> GuiScope::writeExport(std::string_view config, const shader::UniformsMap &uniforms) const {
	return Unexpected(std::string("Not implemented"));
}